

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O3

void __thiscall
LiteScript::Namer::Save(Namer *this,ostream *stream,Namer *namer,offset_in_Memory_to_subr caller)

{
  Namer *pNVar1;
  Object *pOVar2;
  Namer *pNVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  char local_44;
  char local_43;
  char local_42;
  char local_41;
  Namer *local_40;
  offset_in_Memory_to_subr local_38;
  
  local_40 = this;
  pOVar2 = Variable::operator->((Variable *)stream);
  plVar6 = (long *)((long)(pOVar2->memory->arr)._M_elems + caller);
  pNVar3 = namer;
  if (((ulong)namer & 1) != 0) {
    pNVar3 = *(Namer **)((namer->current).data + *plVar6 + -0x11);
  }
  local_38 = caller;
  pOVar2 = Variable::operator->((Variable *)stream);
  (*(code *)pNVar3)(plVar6,local_40,pOVar2->ID);
  pOVar2 = Variable::operator->((Variable *)stream);
  plVar6 = (long *)((long)(pOVar2->memory->arr)._M_elems + local_38);
  pNVar3 = namer;
  if (((ulong)namer & 1) != 0) {
    pNVar3 = *(Namer **)((namer->current).data + *plVar6 + -0x11);
  }
  pOVar2 = Variable::operator->((Variable *)(stream + 0x10));
  pNVar1 = local_40;
  (*(code *)pNVar3)(plVar6,local_40,pOVar2->ID);
  uVar4 = *(long *)(stream + 0x38) - *(long *)(stream + 0x30);
  local_44 = (char)(uVar4 >> 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pNVar1,&local_44,1);
  local_43 = (char)(uVar4 >> 0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pNVar1,&local_43,1);
  local_42 = (char)(uVar4 >> 0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pNVar1,&local_42,1);
  local_41 = (char)(uVar4 >> 0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pNVar1,&local_41,1);
  uVar4 = (ulong)(*(long *)(stream + 0x38) - *(long *)(stream + 0x30)) >> 4;
  if ((int)uVar4 != 0) {
    uVar4 = uVar4 & 0xffffffff;
    lVar5 = 0;
    do {
      pOVar2 = Variable::operator->((Variable *)stream);
      plVar6 = (long *)((long)(pOVar2->memory->arr)._M_elems + local_38);
      pNVar3 = namer;
      if (((ulong)namer & 1) != 0) {
        pNVar3 = *(Namer **)((namer->current).data + *plVar6 + -0x11);
      }
      pOVar2 = Variable::operator->((Variable *)(*(long *)(stream + 0x30) + lVar5));
      (*(code *)pNVar3)(plVar6,local_40,pOVar2->ID);
      lVar5 = lVar5 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void LiteScript::Namer::Save(std::ostream &stream, Namer &namer, bool (Memory::*caller)(std::ostream&, unsigned int)) {
    (namer.global->memory.*caller)(stream, namer.global->ID);
    (namer.global->memory.*caller)(stream, (*namer.current)->ID);
    OStreamer::Write<unsigned int>(stream, namer.heap.size());
    for (unsigned int i = 0, sz = namer.heap.size(); i < sz; i++)
        (namer.global->memory.*caller)(stream, namer.heap[i]->ID);
}